

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

void __thiscall pbrt::SpotLight::PDF_Le(SpotLight *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  
  *pdfPos = 0.0;
  fVar8 = 1.0;
  fVar7 = this->cosFalloffStart;
  fVar1 = this->cosFalloffEnd;
  auVar6 = vfmadd132ss_fma(ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][0]),
                           ZEXT416((uint)((ray->d).super_Tuple3<pbrt::Vector3,_float>.y *
                                         (this->super_LightBase).renderFromLight.mInv.m[2][1])),
                           ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.x));
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][2]
                                         ),
                           ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.z));
  fVar3 = fVar7 - fVar1;
  fVar2 = fVar3 * 0.5;
  fVar4 = 1.0 - fVar7;
  fVar11 = auVar6._0_4_;
  if (fVar7 <= fVar11) {
    fVar7 = (fVar4 * (1.0 / (fVar4 * 6.2831855))) / (fVar4 + fVar2);
  }
  else {
    auVar6 = ZEXT816(0);
    if ((fVar1 <= fVar11) && (fVar11 <= fVar7)) {
      if ((fVar1 != fVar7) || (NAN(fVar1) || NAN(fVar7))) {
        auVar9._0_4_ = (fVar11 - fVar1) / fVar3;
        auVar9._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar10._0_12_ = ZEXT812(0);
        auVar10._12_4_ = 0;
        auVar6 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar9);
        uVar5 = vcmpss_avx512f(auVar9,auVar10,1);
        fVar7 = (float)((uint)!(bool)((byte)uVar5 & 1) * auVar6._0_4_);
        auVar6._0_4_ = fVar7;
        auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar6,ZEXT416(0x40400000));
        fVar8 = fVar7 * fVar7 * auVar6._0_4_;
      }
      auVar6 = ZEXT416((uint)((2.0 / fVar3) * fVar8));
    }
    auVar9 = vblendps_avx(ZEXT416((uint)(fVar4 + fVar2)),_DAT_0061a030,0xe);
    auVar6 = vinsertps_avx(ZEXT416((uint)fVar2),auVar6,0x10);
    auVar6 = vdivps_avx(auVar6,auVar9);
    auVar9 = vmovshdup_avx(auVar6);
    fVar7 = auVar6._0_4_ * auVar9._0_4_;
  }
  *pdfDir = fVar7;
  return;
}

Assistant:

void SpotLight::PDF_Le(const Ray &ray, Float *pdfPos, Float *pdfDir) const {
    *pdfPos = 0;

    // Unnormalized probabilities of sampling each part.
    Float p[2] = {1 - cosFalloffStart, (cosFalloffStart - cosFalloffEnd) / 2};

    Float cosTheta = CosTheta(renderFromLight.ApplyInverse(ray.d));
    if (cosTheta >= cosFalloffStart)
        *pdfDir = UniformConePDF(cosFalloffStart) * p[0] / (p[0] + p[1]);
    else
        *pdfDir = SmoothStepPDF(cosTheta, cosFalloffEnd, cosFalloffStart) / (2 * Pi) *
                  (p[1] / (p[0] + p[1]));
}